

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMRangeImpl::setStartAfter(DOMRangeImpl *this,DOMNode *refNode)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  DOMException *pDVar4;
  DOMRangeException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMNode *pDVar5;
  DOMNode *local_60;
  DOMNode *local_38;
  DOMNode *n;
  XMLSize_t i;
  DOMNode *refNode_local;
  DOMRangeImpl *this_local;
  
  if ((this->fDetached & 1U) != 0) {
    pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(pDVar4,0xb,0,this->fMemoryManager);
    __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
  }
  bVar2 = hasLegalRootContainer(this,refNode);
  if ((bVar2) && (bVar2 = isLegalContainedNode(this,refNode), bVar2)) {
    pDVar1 = this->fDocument;
    iVar3 = (*refNode->_vptr_DOMNode[0xc])();
    if (pDVar1 != (DOMDocument *)CONCAT44(extraout_var,iVar3)) {
      local_60 = (DOMNode *)0x0;
      if (this->fDocument != (DOMDocument *)0x0) {
        local_60 = &this->fDocument->super_DOMNode;
      }
      if (refNode != local_60) {
        (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
        this->fCollapsed = true;
        pDVar4 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(pDVar4,4,0,this->fMemoryManager);
        __cxa_throw(pDVar4,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
    iVar3 = (*refNode->_vptr_DOMNode[5])();
    this->fStartContainer = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
    n = (DOMNode *)0x0;
    local_38 = refNode;
    while (local_38 != (DOMNode *)0x0) {
      n = (DOMNode *)((long)&n->_vptr_DOMNode + 1);
      iVar3 = (*local_38->_vptr_DOMNode[9])();
      local_38 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
    }
    this->fStartOffset = (XMLSize_t)n;
    pDVar5 = commonAncestorOf(this,refNode,this->fEndContainer);
    if (pDVar5 == (DOMNode *)0x0) {
      (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
    }
    iVar3 = (*(this->super_DOMRange)._vptr_DOMRange[0x11])(this,3);
    if ((short)iVar3 == 1) {
      (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
    }
    else {
      this->fCollapsed = false;
    }
    return;
  }
  this_00 = (DOMRangeException *)__cxa_allocate_exception(0x28);
  DOMRangeException::DOMRangeException(this_00,0x70,0,this->fMemoryManager);
  __cxa_throw(this_00,&DOMRangeException::typeinfo,DOMRangeException::~DOMRangeException);
}

Assistant:

void DOMRangeImpl::setStartAfter(const DOMNode* refNode)
{
    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }
    if ( !hasLegalRootContainer(refNode) || !isLegalContainedNode(refNode)) {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // error if not the same owner document
    if (fDocument != refNode->getOwnerDocument()) {
        if ( refNode != fDocument ) {
            collapse(true); //collapse the range positions to start
            fCollapsed = true;
            throw DOMException(
                DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
        }
    }

    fStartContainer = refNode->getParentNode();
    XMLSize_t i = 0;
    for (DOMNode* n = (DOMNode*) refNode; n!=0; n = n->getPreviousSibling()) {
        i++;
    }

    fStartOffset = i;

    // they may be of same document, but not same root container
    // collapse if not the same root container
    if (!commonAncestorOf(refNode, fEndContainer))
        collapse(true);

    //compare the start and end boundary point
    //collapse if start point is after the end point
    if(compareBoundaryPoints(DOMRange::END_TO_START, this) == 1)
        collapse(true); //collapse the range positions to start
    else
        fCollapsed = false;
}